

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_AddTxOut_RemoveTxOut_Test::~AbstractTransaction_AddTxOut_RemoveTxOut_Test
          (AbstractTransaction_AddTxOut_RemoveTxOut_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxOut_RemoveTxOut) {
  uint32_t txout_count = 1;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint64_t satoshi = 0x12345678;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxOut(Amount::CreateBySatoshiAmount(satoshi),
                  Script("0014913e0b9281dab16f502101ad4e655074396f34c5")));

  std::vector<TxOutReference> list = tx.GetTxOutList();
  EXPECT_EQ(list[0].GetValue(), satoshi);
  EXPECT_STREQ(list[0].GetLockingScript().GetHex().c_str(),
      "0014913e0b9281dab16f502101ad4e655074396f34c5");
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);

  // index error
  EXPECT_THROW(tx.RemoveTxOut(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  txout_count--;
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);
}